

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O2

MPP_RET vcodec_service_reg_rd(void *ctx,MppDevRegRdCfg *cfg)

{
  int iVar1;
  
  iVar1 = *(int *)((long)ctx + 0x1c);
  if (cfg->offset != 0) {
    _mpp_log_l(2,"vcodec_service","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->offset == 0",
               "vcodec_service_reg_rd",0x265);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  *(void **)((long)ctx + (long)iVar1 * 0xa0 + 0xc0) = cfg->reg;
  if (*(RK_U32 *)((long)ctx + (long)iVar1 * 0xa0 + 0x28) != cfg->size) {
    _mpp_log_l(2,"vcodec_service","reg size mismatch rd %d rd %d\n","vcodec_service_reg_rd");
  }
  return MPP_OK;
}

Assistant:

MPP_RET vcodec_service_reg_rd(void *ctx, MppDevRegRdCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *send_cfg = &p->regs[p->reg_send_idx];

    mpp_assert(cfg->offset == 0);
    send_cfg->reg_get = cfg->reg;
    if (send_cfg->reg_size != cfg->size)
        mpp_err_f("reg size mismatch rd %d rd %d\n",
                  send_cfg->reg_size, cfg->size);

    return MPP_OK;
}